

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

void __thiscall NaVector::read_file(NaVector *this,NaDataFile *pDF,int iVar)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 *puVar3;
  undefined8 extraout_XMM0_Qa;
  
  if (pDF != (NaDataFile *)0x0) {
    uVar1 = (*pDF->_vptr_NaDataFile[7])(pDF);
    (*this->_vptr_NaVector[4])(this,(ulong)uVar1);
    (*pDF->_vptr_NaDataFile[5])(pDF);
    iVar2 = (*pDF->_vptr_NaDataFile[4])(pDF);
    if ((char)iVar2 != '\0') {
      uVar1 = 0;
      do {
        (*pDF->_vptr_NaDataFile[3])(pDF,(ulong)(uint)iVar);
        iVar2 = (*this->_vptr_NaVector[7])(this,(ulong)uVar1);
        *(undefined8 *)CONCAT44(extraout_var,iVar2) = extraout_XMM0_Qa;
        uVar1 = uVar1 + 1;
        iVar2 = (*pDF->_vptr_NaDataFile[4])(pDF);
      } while ((char)iVar2 != '\0');
    }
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void
NaVector::read_file (NaDataFile* pDF, int iVar)
{
    if(NULL == pDF)
        throw(na_null_pointer);

    new_dim(pDF->CountOfRecord());

    unsigned    i;
    for(i = 0, pDF->GoStartRecord(); pDF->GoNextRecord(); ++i){
        fetch(i) = pDF->GetValue(iVar);
    }   // Cycle for all data in file
}